

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

void Sim_UtilSimulateNode(Sim_Man_t *p,Abc_Obj_t *pNode,int fType,int fType1,int fType2)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  
  uVar1 = *(uint *)&pNode->field_0x14;
  if ((uVar1 & 0xf) == 7) {
    pvVar2 = (&p->vSim0)[fType != 0]->pArray[pNode->Id];
    piVar3 = (pNode->vFanins).pArray;
    pvVar4 = (&p->vSim0)[fType1 != 0]->pArray[*piVar3];
    pvVar5 = (&p->vSim0)[fType2 != 0]->pArray[piVar3[1]];
    if ((uVar1 >> 0xb & 1) == 0 || (uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 10 & 1) == 0 || (uVar1 >> 0xb & 1) != 0) {
        if (((byte)(uVar1 >> 0xb) & (uVar1 >> 10 & 1) == 0) == 0) {
          if (0 < p->nSimWords) {
            lVar6 = 0;
            do {
              *(uint *)((long)pvVar2 + lVar6 * 4) =
                   *(uint *)((long)pvVar5 + lVar6 * 4) & *(uint *)((long)pvVar4 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 < p->nSimWords);
          }
        }
        else if (0 < p->nSimWords) {
          lVar6 = 0;
          do {
            *(uint *)((long)pvVar2 + lVar6 * 4) =
                 ~*(uint *)((long)pvVar5 + lVar6 * 4) & *(uint *)((long)pvVar4 + lVar6 * 4);
            lVar6 = lVar6 + 1;
          } while (lVar6 < p->nSimWords);
        }
      }
      else if (0 < p->nSimWords) {
        lVar6 = 0;
        do {
          *(uint *)((long)pvVar2 + lVar6 * 4) =
               ~*(uint *)((long)pvVar4 + lVar6 * 4) & *(uint *)((long)pvVar5 + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nSimWords);
      }
    }
    else if (0 < p->nSimWords) {
      lVar6 = 0;
      do {
        *(uint *)((long)pvVar2 + lVar6 * 4) =
             ~(*(uint *)((long)pvVar5 + lVar6 * 4) | *(uint *)((long)pvVar4 + lVar6 * 4));
        lVar6 = lVar6 + 1;
      } while (lVar6 < p->nSimWords);
    }
  }
  else {
    if ((pNode->vFanins).nSize != 1) {
      __assert_fail("Abc_ObjFaninNum(pNode) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simUtils.c"
                    ,0x10e,"void Sim_UtilSimulateNode(Sim_Man_t *, Abc_Obj_t *, int, int, int)");
    }
    pvVar2 = (&p->vSim0)[fType != 0]->pArray[pNode->Id];
    pvVar4 = (&p->vSim0)[fType1 != 0]->pArray[*(pNode->vFanins).pArray];
    if ((uVar1 >> 10 & 1) == 0) {
      if (0 < p->nSimWords) {
        lVar6 = 0;
        do {
          *(undefined4 *)((long)pvVar2 + lVar6 * 4) = *(undefined4 *)((long)pvVar4 + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nSimWords);
      }
    }
    else if (0 < p->nSimWords) {
      lVar6 = 0;
      do {
        *(uint *)((long)pvVar2 + lVar6 * 4) = ~*(uint *)((long)pvVar4 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 < p->nSimWords);
    }
  }
  return;
}

Assistant:

void Sim_UtilSimulateNode( Sim_Man_t * p, Abc_Obj_t * pNode, int fType, int fType1, int fType2 )
{
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    if ( Abc_ObjIsNode(pNode) )
    {
        if ( fType )
            pSimmNode  = (unsigned *)p->vSim1->pArray[ pNode->Id ];
        else
            pSimmNode  = (unsigned *)p->vSim0->pArray[ pNode->Id ];

        if ( fType1 )
            pSimmNode1 = (unsigned *)p->vSim1->pArray[ Abc_ObjFaninId0(pNode) ];
        else
            pSimmNode1 = (unsigned *)p->vSim0->pArray[ Abc_ObjFaninId0(pNode) ];

        if ( fType2 )
            pSimmNode2 = (unsigned *)p->vSim1->pArray[ Abc_ObjFaninId1(pNode) ];
        else
            pSimmNode2 = (unsigned *)p->vSim0->pArray[ Abc_ObjFaninId1(pNode) ];

        fComp1 = Abc_ObjFaninC0(pNode);
        fComp2 = Abc_ObjFaninC1(pNode);
        if ( fComp1 && fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] = ~pSimmNode1[k] & ~pSimmNode2[k];
        else if ( fComp1 && !fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] = ~pSimmNode1[k] &  pSimmNode2[k];
        else if ( !fComp1 && fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] =  pSimmNode1[k] & ~pSimmNode2[k];
        else // if ( fComp1 && fComp2 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] =  pSimmNode1[k] &  pSimmNode2[k];
    }
    else 
    {
        assert( Abc_ObjFaninNum(pNode) == 1 );
        if ( fType )
            pSimmNode  = (unsigned *)p->vSim1->pArray[ pNode->Id ];
        else
            pSimmNode  = (unsigned *)p->vSim0->pArray[ pNode->Id ];

        if ( fType1 )
            pSimmNode1 = (unsigned *)p->vSim1->pArray[ Abc_ObjFaninId0(pNode) ];
        else
            pSimmNode1 = (unsigned *)p->vSim0->pArray[ Abc_ObjFaninId0(pNode) ];

        fComp1 = Abc_ObjFaninC0(pNode);
        if ( fComp1 )
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] = ~pSimmNode1[k];
        else 
            for ( k = 0; k < p->nSimWords; k++ )
                pSimmNode[k] =  pSimmNode1[k];
    }
}